

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O1

Vertex * __thiscall MeshLib::Solid::edgeSplit(Solid *this,Edge *e)

{
  int *piVar1;
  int iVar2;
  Face *pFVar3;
  pointer pcVar4;
  Edge *pEVar5;
  HalfEdge *pHVar6;
  int i;
  tVertex pVVar7;
  Node<MeshLib::Edge> *pNVar8;
  Node<MeshLib::Face> *pNVar9;
  long lVar10;
  long lVar11;
  tFace pFVar12;
  ListNode<MeshLib::Face> *pLVar13;
  HalfEdge *pHVar14;
  int iVar15;
  Tree<MeshLib::Face> *tree;
  int iVar16;
  long lVar17;
  bool bVar18;
  tVertex w [3];
  int vid [3];
  List<MeshLib::Face> new_faces;
  tHalfEdge hes [2];
  tVertex v [3];
  TreeIterator<MeshLib::Face> fiter;
  TreeIterator<MeshLib::Vertex> viter;
  tVertex local_2c8;
  long local_2c0;
  undefined8 local_2b8;
  int local_2ac [3];
  List<MeshLib::Face> local_2a0;
  Tree<MeshLib::Face> *local_290;
  HalfEdge *local_288 [2];
  long local_278 [3];
  TreeIterator<MeshLib::Face> local_260;
  TreeIterator<MeshLib::Vertex> local_148;
  
  AVL::TreeIterator<MeshLib::Vertex>::TreeIterator(&local_148,&this->m_verts);
  iVar15 = 0;
  if (local_148.m_finished == false) {
    iVar15 = -1;
    do {
      iVar16 = (local_148.m_pointer)->data->m_id;
      if (iVar16 < iVar15) {
        iVar16 = iVar15;
      }
      iVar15 = iVar16;
      AVL::TreeIterator<MeshLib::Vertex>::operator++(&local_148);
    } while (local_148.m_finished != true);
    iVar15 = iVar15 + 1;
  }
  tree = &this->m_faces;
  AVL::TreeIterator<MeshLib::Face>::TreeIterator(&local_260,tree);
  iVar16 = -1;
  if (local_260.m_finished == false) {
    iVar16 = -1;
    do {
      iVar2 = (local_260.m_pointer)->data->m_id;
      if (iVar16 <= iVar2) {
        iVar16 = iVar2;
      }
      AVL::TreeIterator<MeshLib::Face>::operator++(&local_260);
    } while (local_260.m_finished != true);
  }
  pVVar7 = createVertex(this,iVar15);
  local_288[0] = e->m_halfedge[0];
  local_288[1] = e->m_halfedge[1];
  pVVar7->m_boundary = local_288[1] == (HalfEdge *)0x0;
  pNVar8 = AVL::Node<MeshLib::Edge>::remove_node((this->m_edges).root,e);
  (this->m_edges).root = pNVar8;
  if (pNVar8 != (Node<MeshLib::Edge> *)0x0) {
    piVar1 = &(this->m_edges).size;
    *piVar1 = *piVar1 + -1;
  }
  local_2a0.m_head = (ListNode<MeshLib::Face> *)0x0;
  local_2a0.m_size = 0;
  lVar17 = 0;
  local_290 = tree;
  do {
    pHVar14 = local_288[lVar17];
    if (pHVar14 != (HalfEdge *)0x0) {
      pFVar3 = pHVar14->m_face;
      pNVar9 = AVL::Node<MeshLib::Face>::remove_node(tree->root,pFVar3);
      tree->root = pNVar9;
      if (pNVar9 != (Node<MeshLib::Face> *)0x0) {
        piVar1 = &(this->m_faces).size;
        *piVar1 = *piVar1 + -1;
      }
      if (pFVar3 != (Face *)0x0) {
        pcVar4 = (pFVar3->m_string)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != &(pFVar3->m_string).field_2) {
          operator_delete(pcVar4);
        }
        operator_delete(pFVar3);
      }
      lVar10 = 0;
      do {
        local_278[lVar10] = (long)pHVar14->m_vertex;
        pEVar5 = pHVar14->m_edge;
        if (pEVar5->m_halfedge[0] == pHVar14) {
          pEVar5->m_halfedge[0] = pEVar5->m_halfedge[1];
        }
        pEVar5->m_halfedge[1] = (HalfEdge *)0x0;
        pHVar14 = pHVar14->m_next;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      iVar15 = 3;
      do {
        pHVar6 = pHVar14->m_next;
        pcVar4 = (pHVar14->m_string)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != &(pHVar14->m_string).field_2) {
          operator_delete(pcVar4);
        }
        operator_delete(pHVar14);
        lVar10 = local_278[1];
        iVar15 = iVar15 + -1;
        pHVar14 = pHVar6;
      } while (iVar15 != 0);
      local_2c8 = pVVar7;
      local_2c0 = local_278[0];
      local_2b8 = local_278[1];
      lVar11 = 0;
      do {
        local_2ac[lVar11] = (&local_2c8)[lVar11]->m_id;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      pFVar12 = createFace(this,local_2ac,iVar16 + 1);
      tree = local_290;
      List<MeshLib::Face>::Append(&local_2a0,pFVar12);
      local_2c8 = pVVar7;
      local_2c0 = lVar10;
      local_2b8 = local_278[2];
      lVar10 = 0;
      do {
        local_2ac[lVar10] = (&local_2c8)[lVar10]->m_id;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      iVar16 = iVar16 + 2;
      pFVar12 = createFace(this,local_2ac,iVar16);
      List<MeshLib::Face>::Append(&local_2a0,pFVar12);
    }
    bVar18 = lVar17 == 0;
    pLVar13 = local_2a0.m_head;
    lVar17 = lVar17 + 1;
  } while (bVar18);
  for (; pLVar13 != (ListNode<MeshLib::Face> *)0x0; pLVar13 = pLVar13->m_next) {
    pFVar3 = pLVar13->m_data;
    pHVar14 = pFVar3->m_halfedge;
    do {
      pEVar5 = pHVar14->m_edge;
      if ((pEVar5->m_halfedge[1] != (HalfEdge *)0x0) &&
         (pHVar6 = pEVar5->m_halfedge[0], pHVar6->m_vertex->m_id < pHVar6->m_prev->m_vertex->m_id))
      {
        pEVar5->m_halfedge[0] = pEVar5->m_halfedge[1];
        pEVar5->m_halfedge[1] = pHVar6;
      }
      pHVar14 = pHVar14->m_next;
    } while (pHVar14 != pFVar3->m_halfedge);
  }
  pcVar4 = (e->m_string)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != &(e->m_string).field_2) {
    operator_delete(pcVar4);
  }
  operator_delete(e);
  List<MeshLib::Face>::~List(&local_2a0);
  return pVVar7;
}

Assistant:

Vertex * Solid::edgeSplit( Edge * e )
{
	//find the max_id for vertices;

	AVL::TreeIterator<Vertex> viter(m_verts);

	int max_vid = -1;

	for( ; !viter.end(); ++viter )
	{
		max_vid = ( max_vid > (*viter)->id() )? max_vid: (*viter)->id();
	}

	AVL::TreeIterator<Face> fiter(m_faces);

	int max_fid = -1;

	for( ; !fiter.end(); ++fiter )
	{
		max_fid = ( max_fid > (*fiter)->id() )? max_fid: (*fiter)->id();
	}

	//create a new vertex

	tVertex nv = createVertex( ++max_vid );

	tHalfEdge hes[2];
	hes[0] = e->halfedge(0);
	hes[1] = e->halfedge(1);

	nv->boundary() = (hes[1]==NULL);

	m_edges.remove( e );


	List<Face> new_faces;

	for( int j = 0; j < 2; j ++ )
	{
		tVertex v[3];
		tHalfEdge he = hes[j];

		if( he == NULL ) continue;

		tFace  f = he->face();
		m_faces.remove( f );
		delete f;

		for( int i = 0; i < 3; i ++ )
		{
			v[i] = he->target();
			
			tEdge te = he->edge();
			if( te->halfedge(0) == he )
			{
				te->halfedge(0) = te->halfedge(1);
			}
			te->halfedge(1) = NULL;

			he = he->he_next();
		}

		int k;
		for( k = 0; k < 3; k ++ )
		{
			tHalfEdge ne = he->he_next();
			delete he;
			he = ne;
		}

		int vid[3];
		tVertex w[3];
		w[0] = nv; w[1] = v[0]; w[2] = v[1];
		for( k = 0; k < 3; k ++ )
		{
			vid[k] = w[k]->id(); 
		}		

		Face * nf = createFace( vid, ++max_fid );
		new_faces.Append( nf );

		w[0] = nv; w[1] = v[1]; w[2] = v[2];
		for( k = 0; k < 3; k ++ )
		{
			vid[k] = w[k]->id(); 
		}	
		nf = createFace( vid, ++ max_fid );
		new_faces.Append( nf );
	}	


	for( ListIterator<Face> iter( new_faces ); !iter.end(); ++ iter )
	{
		Face * f = *iter;
		HalfEdge * he = f->halfedge();

		do{
			Edge     * e = he->edge();
			if( e->halfedge(1) != NULL )
			{
				HalfEdge * h = e->halfedge(0);
				if( h->target()->id() < h->source()->id() )
				{
					e->halfedge(0) = e->halfedge(1);
					e->halfedge(1) = h;
				}
			}
			he = he->he_next();
		}while( he != f->halfedge() );
	}

	delete e;
	return nv;	
}